

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void helper_syscall_x86_64(CPUX86State *env,int next_eip_addend)

{
  void *pvVar1;
  uc_struct_conflict *puVar2;
  list_item *plVar3;
  
  puVar2 = env->uc;
  plVar3 = (list_item *)(puVar2->hook + 1);
  do {
    do {
      do {
        plVar3 = plVar3->next;
        if ((plVar3 == (list_item *)0x0) || (pvVar1 = plVar3->data, pvVar1 == (void *)0x0))
        goto LAB_004d5b61;
      } while (*(char *)((long)pvVar1 + 0x14) != '\0');
    } while ((env->eip < *(ulong *)((long)pvVar1 + 0x18) ||
              *(ulong *)((long)pvVar1 + 0x20) < env->eip) &&
            (*(ulong *)((long)pvVar1 + 0x18) <= *(ulong *)((long)pvVar1 + 0x20)));
    if (*(int *)((long)pvVar1 + 4) == 699) {
      (**(code **)((long)pvVar1 + 0x28))(puVar2,*(undefined8 *)((long)pvVar1 + 0x30));
      puVar2 = env->uc;
    }
  } while (puVar2->stop_request != true);
LAB_004d5b61:
  env->eip = env->eip + (long)next_eip_addend;
  return;
}

Assistant:

void helper_syscall(CPUX86State *env, int next_eip_addend)
{
    // Unicorn: call registered syscall hooks
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;
    HOOK_FOREACH(env->uc, hook, UC_HOOK_INSN) {
        if (hook->to_delete)
            continue;
        if (!HOOK_BOUND_CHECK(hook, env->eip))
            continue;
        if (hook->insn == UC_X86_INS_SYSCALL)
            ((uc_cb_insn_syscall_t)hook->callback)(env->uc, hook->user_data);

        // the last callback may already asked to stop emulation
        if (env->uc->stop_request)
            break;
    }

    env->eip += next_eip_addend;
}